

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O3

double __thiscall
Alg::opimb_naive(Alg *this,Graph *graph,double budget,
                vector<double,_std::allocator<double>_> *budget_list,double epsilon,double delta,
                int mode)

{
  THyperGraph *this_00;
  double *pdVar1;
  TResult *pTVar2;
  undefined1 auVar3 [12];
  Alg *pAVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  const_iterator __begin1;
  long lVar8;
  long *plVar9;
  double *pdVar10;
  ostream *poVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  double *pdVar16;
  Graph *graph_00;
  size_t numSamples;
  byte bVar17;
  double dVar18;
  double dVar19;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  vector<double,_std::allocator<double>_> *__range1;
  double timeb;
  char local_169;
  double local_168;
  Alg *local_160;
  double local_158;
  double local_150;
  double local_148;
  double dStack_140;
  double local_138;
  vector<double,_std::allocator<double>_> *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  double local_108;
  int local_fc;
  double local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  double local_e0;
  Nodelist *local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double dStack_a0;
  long local_98;
  double local_90;
  double local_88;
  double local_80;
  THyperGraph *local_78;
  HyperGraph *local_70;
  long local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  local_118._8_8_ = local_118._0_8_;
  local_118._0_8_ = delta;
  local_160 = this;
  local_158 = epsilon;
  local_138 = budget;
  local_130 = budget_list;
  lVar8 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mode: ",6);
  local_fc = mode;
  plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,mode);
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  local_128 = 6.0 / (double)local_118._0_8_;
  local_148 = log(local_128);
  if (local_148 < 0.0) {
    local_148 = sqrt(local_148);
  }
  else {
    local_148 = SQRT(local_148);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_48,local_130);
  iVar6 = cal_k_max(&local_48,local_138);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_60,local_130);
  iVar7 = cal_k_min(&local_60,local_138);
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pdVar10 = (local_130->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pdVar1 = (local_130->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar10 == pdVar1) {
    dVar18 = 4294967295.0;
    dVar25 = 0.0;
  }
  else {
    pdVar16 = pdVar10;
    dVar18 = 0.0;
    do {
      dVar25 = *pdVar16;
      if (*pdVar16 <= dVar18) {
        dVar25 = dVar18;
      }
      pdVar16 = pdVar16 + 1;
      dVar18 = dVar25;
    } while (pdVar16 != pdVar1);
    dVar18 = 4294967295.0;
    do {
      dVar19 = *pdVar10;
      dVar18 = (double)(~-(ulong)(dVar19 < dVar18) & (ulong)dVar18 |
                       (~-(ulong)(0.0001 < ABS(dVar19)) & (ulong)dVar18 |
                       -(ulong)(0.0001 < ABS(dVar19)) & (ulong)dVar19) & -(ulong)(dVar19 < dVar18));
      pdVar10 = pdVar10 + 1;
    } while (pdVar10 != pdVar1);
  }
  dVar25 = local_138 / dVar25;
  dVar18 = local_138 / dVar18;
  local_98 = lVar8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"k_max: ",7);
  plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"k_min: ",7);
  plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"targetSize_max: ",0x10);
  plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)dVar18);
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"targetSize_min: ",0x10);
  plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)dVar25);
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  dVar25 = (double)local_160->__numV;
  local_f8 = dVar25 + dVar25;
  local_150 = (double)iVar6;
  local_168 = log(dVar25);
  dVar25 = log(local_128);
  dVar25 = (local_168 * local_150 + dVar25) * 0.31606027941427883;
  if (dVar25 < 0.0) {
    dVar25 = sqrt(dVar25);
  }
  else {
    dVar25 = SQRT(dVar25);
  }
  local_148 = local_148 * 0.31606027941427883;
  dVar18 = (double)local_160->__numV;
  dVar25 = (local_f8 * (dVar25 + local_148) * (dVar25 + local_148)) / dVar18;
  local_e8 = (ulong)dVar25;
  local_e8 = (long)(dVar25 - 9.223372036854776e+18) & (long)local_e8 >> 0x3f | local_e8;
  local_f8 = dVar18 + dVar18;
  uStack_f0 = 0;
  local_168 = log(dVar18);
  dVar25 = log(local_128);
  dVar25 = (local_168 * local_150 + dVar25) * 0.31606027941427883;
  if (dVar25 < 0.0) {
    dVar25 = sqrt(dVar25);
  }
  else {
    dVar25 = SQRT(dVar25);
  }
  dVar25 = (local_f8 * (local_148 + dVar25) * (local_148 + dVar25)) /
           (local_158 * local_158 * local_150);
  uVar15 = (ulong)dVar25;
  local_168 = 0.0;
  uVar15 = ((long)(dVar25 - 9.223372036854776e+18) & (long)uVar15 >> 0x3f | uVar15) / local_e8;
  auVar22._8_4_ = (int)(uVar15 >> 0x20);
  auVar22._0_8_ = uVar15;
  auVar22._12_4_ = 0x45300000;
  dVar25 = log((auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0));
  uVar15 = (ulong)(dVar25 / 0.6931471805599453);
  local_68 = ((long)(dVar25 / 0.6931471805599453 - 9.223372036854776e+18) & (long)uVar15 >> 0x3f |
             uVar15) + 1;
  auVar23._8_4_ = (int)((ulong)local_68 >> 0x20);
  auVar23._0_8_ = local_68;
  auVar23._12_4_ = 0x45300000;
  dStack_140 = auVar23._8_8_ - 1.9342813113834067e+25;
  local_148 = ((dStack_140 + ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0)) *
              3.0) / (double)local_118._0_8_;
  local_108 = log(local_148);
  dVar25 = log(local_148);
  local_b0 = 0.0;
  local_70 = &local_160->__hyperG;
  this_00 = &local_160->__hyperGVldt;
  local_80 = (local_108 + local_108) / 9.0;
  local_d8 = &local_160->__vecSeed;
  local_d0 = local_108 * 0.5;
  local_108 = local_108 / 18.0;
  local_f8 = 0.31606027941427883 - local_158;
  local_128 = 0.0;
  uStack_120 = 0.0;
  local_88 = SQRT(local_d0);
  local_90 = SQRT(dVar25 * 0.5);
  bVar17 = 0;
  local_158 = dVar25 * 0.5;
  local_78 = this_00;
  while( true ) {
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    numSamples = local_e8 << (bVar17 & 0x3f);
    lVar8 = std::chrono::_V2::system_clock::now();
    HyperGraph::build_n_RRsets(local_70,numSamples);
    HyperGraph::build_n_RRsets(this_00,numSamples);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# RR sets: ",0xb);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    graph_00 = (Graph *)(ulong)(uint)(int)cVar5;
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    pAVar4 = local_160;
    local_160->__numRRsets = (local_160->__hyperG).__numRRsets;
    lVar12 = std::chrono::_V2::system_clock::now();
    local_148 = max_cover_lazy_budget(pAVar4,graph_00,local_138,local_130,&local_b0,local_fc);
    lVar13 = std::chrono::_V2::system_clock::now();
    auVar26._0_8_ = (double)(lVar13 - lVar12);
    auVar26._8_8_ = (double)(lVar12 - lVar8);
    local_118 = divpd(auVar26,_DAT_00132110);
    local_e0 = HyperGraph::self_inf_cal(this_00,local_d8);
    auVar24._0_8_ = (double)CONCAT44(0x43300000,(int)pAVar4->__numRRsets);
    auVar24._8_4_ = (int)(pAVar4->__numRRsets >> 0x20);
    auVar24._12_4_ = 0x45300000;
    dStack_a0 = auVar24._8_8_ - 1.9342813113834067e+25;
    local_a8 = dStack_a0 + (auVar24._0_8_ - 4503599627370496.0);
    local_c8 = (double)pAVar4->__numV;
    dVar25 = (local_e0 * local_a8) / local_c8 + local_80;
    local_150 = local_148 / 0.31606027941427883;
    if (dVar25 < 0.0) {
      local_b8 = sqrt(dVar25);
    }
    else {
      local_b8 = SQRT(dVar25);
    }
    dVar25 = local_88;
    if (local_d0 < 0.0) {
      dVar25 = sqrt(local_d0);
    }
    dVar18 = (local_a8 * local_150) / local_c8 + local_158;
    local_c0 = dVar25;
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
    }
    else {
      dVar18 = SQRT(dVar18);
    }
    dVar25 = local_90;
    if (local_158 < 0.0) {
      local_a8 = dVar18;
      dVar25 = sqrt(local_158);
      dVar18 = local_a8;
    }
    local_128 = local_128 + (double)local_118._0_8_;
    uStack_120 = uStack_120 + (double)local_118._8_8_;
    dVar21 = (local_b8 - local_c0) * (local_b8 - local_c0) - local_108;
    dVar19 = 0.0;
    if (0.0 <= dVar21) {
      dVar19 = dVar21;
    }
    local_118._0_8_ = dVar19 / ((dVar18 + dVar25) * (dVar18 + dVar25));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," -->OPIM-B-NAIVE (",0x12);
    bVar17 = bVar17 + 1;
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"/",1);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,") approx. (max-cover): ",0x17);
    poVar11 = std::ostream::_M_insert<double>((double)local_118._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," (",2);
    poVar11 = std::ostream::_M_insert<double>(local_148 / local_150);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"), #RR sets: ",0xd);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    local_169 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,&local_169,1);
    pAVar4 = local_160;
    uVar14 = SUB84(local_168,0);
    if ((local_f8 <= (double)local_118._0_8_) && (uVar14 == 1)) break;
    if (uVar14 == 0) {
      uVar14 = 1;
    }
    local_168 = (double)((ulong)local_168 & 0xffffffff);
    if (local_f8 <= (double)local_118._0_8_) {
      local_168 = (double)(ulong)uVar14;
    }
  }
  pTVar2 = local_160->__tRes;
  pTVar2->__Approx = (double)local_118._0_8_;
  lVar8 = std::chrono::_V2::system_clock::now();
  pTVar2->__RunningTime = (double)(lVar8 - local_98) / 1000000000.0;
  pTVar2 = pAVar4->__tRes;
  pTVar2->__Influence = local_e0;
  pTVar2->__InfluenceOriginal = local_148;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&pTVar2->__VecSeed,local_d8);
  pTVar2->__SeedSize =
       (int)((ulong)((long)(pAVar4->__vecSeed).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pAVar4->__vecSeed).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&pAVar4->__tRes->__VecSeed_inf,&pAVar4->__vecSeed_inf);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&pAVar4->__tRes->__VecSeed_inf_cost,&pAVar4->__vecSeed_inf_cost);
  pTVar2 = pAVar4->__tRes;
  pTVar2->__BoundMin_inf = pAVar4->__boundMin_inf;
  pTVar2->__BoundMin_inf_cost = pAVar4->__boundMin_inf_cost;
  pTVar2->__RRsetsSize = pAVar4->__numRRsets * 2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==>Influence via R2: ",0x15);
  poVar11 = std::ostream::_M_insert<double>(local_e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,", time: ",8);
  poVar11 = std::ostream::_M_insert<double>(pAVar4->__tRes->__RunningTime);
  local_169 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,&local_169,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==>Time for RR sets and greedy: ",0x20);
  auVar3._4_8_ = extraout_XMM0_Qb;
  auVar3._0_4_ = local_128._4_4_;
  auVar20._0_8_ = auVar3._0_8_ << 0x20;
  auVar20._8_4_ = (undefined4)uStack_120;
  auVar20._12_4_ = uStack_120._4_4_;
  poVar11 = std::ostream::_M_insert<double>(auVar20._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
  local_148 = local_b0;
  poVar11 = std::ostream::_M_insert<double>(local_128 - local_b0);
  local_169 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,&local_169,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==>Time for Bound Computation: ",0x1f);
  poVar11 = std::ostream::_M_insert<double>(local_148);
  local_169 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,&local_169,1);
  return 0.0;
}

Assistant:

double Alg::opimb_naive(const Graph & graph, const double budget, const std::vector<double> & budget_list,
        const double epsilon, const double delta, const int mode) {
    Timer timerOPIMC("OPIM-B-NAIVE");
    std::cout << "mode: " << mode << std::endl;
    const double e_alpha = exp(1);
    const double approx = 0.5 * (1 - 1.0 / e_alpha);
    const double alpha = sqrt(log(6.0 / delta));
    const int k_max = cal_k_max(budget_list, budget);
    const int k_min = cal_k_min(budget_list, budget);
    int targetSize_min = int(budget / max_vector(budget_list));
    int targetSize_max = int(budget / min_vector_nonzero(budget_list));
    std::cout << "k_max: " << k_max << std::endl;
    std::cout << "k_min: " << k_min << std::endl;
    std::cout << "targetSize_max: " << targetSize_max << std::endl;
    std::cout << "targetSize_min: " << targetSize_min << std::endl;
    const auto theta_zero = (size_t) ((2.0 * __numV * pow2(0.5 * (1 - 1 / e_alpha) * alpha
            + sqrt(0.5 * (1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (__numV));
    const auto theta_max = (size_t) ((2.0 * __numV * pow2(0.5 * (1 - 1 / e_alpha) * alpha
            + sqrt(0.5 * (1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (pow2(epsilon) * k_max));
    const auto numIter = (size_t) log2(theta_max / theta_zero) + 1;
    const double a1 = log(numIter * 3.0 / delta);
    const double a2 = log(numIter * 3.0 / delta);
    double time1 = 0.0, time2 = 0.0;
    double timeb = 0.0;
    size_t idx = 0;
    int satisfy_count = 0;
    while (true) {
        std::cout << idx << std::endl;
        const auto numR = theta_zero << idx;
        timerOPIMC.get_operation_time();
        __hyperG.build_n_RRsets(numR); // R1
        __hyperGVldt.build_n_RRsets(numR); // R2
        std::cout << "# RR sets: " << numR << std::endl;
        __numRRsets = __hyperG.get_RR_sets_size();
        time1 += timerOPIMC.get_operation_time();
        const auto infSelf = max_cover_budget(graph, budget, budget_list, timeb, mode);
        time2 += timerOPIMC.get_operation_time();
        const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        const auto degVldt = infVldt * __numRRsets / __numV;
        auto upperBound = infSelf / approx;
        const auto upperDegOPT = upperBound * __numRRsets / __numV;
        auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        const auto approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-B-NAIVE (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " << approxOPIMC <<
                  " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        // Check whether the requirement is satisfied
        if (approxOPIMC >= approx - epsilon && satisfy_count == 1)
        {
            __tRes.set_approximation(approxOPIMC);
            __tRes.set_running_time(timerOPIMC.get_total_time());
            __tRes.set_influence(infVldt);
            __tRes.set_influence_original(infSelf);
            __tRes.set_seed_vec(__vecSeed);
            __tRes.set_seed_inf_vec(__vecSeed_inf);
            __tRes.set_seed_inf_cost_vec(__vecSeed_inf_cost);
            __tRes.set_boundmin_inf(__boundMin_inf);
            __tRes.set_boundmin_inf_cost(__boundMin_inf_cost);
            __tRes.set_RR_sets_size(__numRRsets * 2);
            std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
            std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 - timeb << '\n';
            std::cout << "==>Time for Bound Computation: " << timeb << '\n';
            return 0;
        }
        else if (approxOPIMC >= approx - epsilon && satisfy_count == 0) {
            satisfy_count = satisfy_count + 1;
        }
        idx = idx + 1;
    }
}